

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Scanner::scanToNextToken(Scanner *this)

{
  iterator pcVar1;
  bool bVar2;
  iterator i;
  Scanner *this_local;
  
  while( true ) {
    while( true ) {
      bVar2 = true;
      if (*this->Current != ' ') {
        bVar2 = *this->Current == '\t';
      }
      if (!bVar2) break;
      skip(this,1);
    }
    skipComment(this);
    pcVar1 = skip_b_break(this,this->Current);
    if (pcVar1 == this->Current) break;
    this->Current = pcVar1;
    this->Line = this->Line + 1;
    this->Column = 0;
    if (this->FlowLevel == 0) {
      this->IsSimpleKeyAllowed = true;
    }
  }
  return;
}

Assistant:

void Scanner::scanToNextToken() {
  while (true) {
    while (*Current == ' ' || *Current == '\t') {
      skip(1);
    }

    skipComment();

    // Skip EOL.
    StringRef::iterator i = skip_b_break(Current);
    if (i == Current)
      break;
    Current = i;
    ++Line;
    Column = 0;
    // New lines may start a simple key.
    if (!FlowLevel)
      IsSimpleKeyAllowed = true;
  }
}